

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-gvec-desc.h
# Opt level: O1

void helper_sve_rev_b_aarch64(void *vd,void *vn,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((desc & 0x1f) << 3);
  uVar3 = 0;
  do {
    uVar1 = *(ulong *)((long)vn + uVar4);
    uVar2 = *(ulong *)((long)vn + uVar3);
    *(ulong *)((long)vd + uVar3) =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    *(ulong *)((long)vd + uVar4) =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar3 = uVar3 + 8;
    uVar4 = uVar4 - 8;
  } while (uVar3 < (desc & 0x1f) * 8 + 8 >> 1);
  return;
}

Assistant:

static inline intptr_t simd_oprsz(uint32_t desc)
{
    return (extract32(desc, SIMD_OPRSZ_SHIFT, SIMD_OPRSZ_BITS) + 1) * 8;
}